

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O1

void MWT::predict_or_learn<false,false,false>(mwt *c,single_learner *base,example *ec)

{
  byte bVar1;
  float *pfVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  double dVar5;
  bool bVar6;
  cb_class *pcVar7;
  cb_class *cl;
  float *pfVar8;
  policy_data *ppVar9;
  uint64_t *puVar10;
  unsigned_long *puVar11;
  byte *pbVar12;
  v_array<float> preds;
  float local_6c;
  example *local_68;
  byte *local_60;
  v_array<float> local_58;
  
  for (pcVar7 = (cb_class *)(ec->l).cs.costs._begin; pcVar7 != (cb_class *)(ec->l).cs.costs._end;
      pcVar7 = pcVar7 + 1) {
    if ((pcVar7 == (cb_class *)0x0) ||
       (((pcVar7->cost == 3.4028235e+38 && (!NAN(pcVar7->cost))) ||
        (bVar6 = true, pcVar7->probability <= 0.0)))) {
      bVar6 = false;
    }
    if (bVar6) goto LAB_001b6f15;
  }
  pcVar7 = (cb_class *)0x0;
LAB_001b6f15:
  c->observation = pcVar7;
  if (pcVar7 != (cb_class *)0x0) {
    c->total = c->total + 1.0;
    pbVar12 = (ec->super_example_predict).indices._begin;
    local_60 = (ec->super_example_predict).indices._end;
    local_68 = ec;
    if (pbVar12 != local_60) {
      do {
        bVar1 = *pbVar12;
        if (c->namespaces[bVar1] == true) {
          pfVar8 = (ec->super_example_predict).feature_space[bVar1].values._begin;
          pfVar2 = (ec->super_example_predict).feature_space[bVar1].values._end;
          if (pfVar8 != pfVar2) {
            puVar10 = (ec->super_example_predict).feature_space[bVar1].indicies._begin;
            do {
              value_policy(c,*pfVar8,*puVar10);
              pfVar8 = pfVar8 + 1;
              puVar10 = puVar10 + 1;
            } while (pfVar8 != pfVar2);
          }
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != local_60);
    }
    puVar3 = (c->policies)._end;
    for (puVar11 = (c->policies)._begin; ec = local_68, puVar11 != puVar3; puVar11 = puVar11 + 1) {
      uVar4 = *puVar11;
      ppVar9 = (c->evals)._begin;
      pcVar7 = c->observation;
      dVar5 = 0.0;
      if (pcVar7->action == ppVar9[uVar4].action) {
        dVar5 = (double)(pcVar7->cost / pcVar7->probability);
      }
      ppVar9 = ppVar9 + uVar4;
      ppVar9->cost = dVar5 + ppVar9->cost;
      (c->evals)._begin[uVar4].action = 0;
    }
  }
  local_58._begin = (ec->pred).scalars._begin;
  local_58._end = (ec->pred).scalars._end;
  local_58.end_array = (ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<float>::clear(&local_58);
  puVar11 = (c->policies)._begin;
  puVar3 = (c->policies)._end;
  if (puVar11 != puVar3) {
    do {
      local_6c = (float)(c->evals)._begin[*puVar11].cost / (float)c->total;
      v_array<float>::push_back(&local_58,&local_6c);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar3);
  }
  (ec->pred).scalars.end_array = local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).scalars._begin = local_58._begin;
  (ec->pred).scalars._end = local_58._end;
  return;
}

Assistant:

void predict_or_learn(mwt& c, single_learner& base, example& ec)
{
  c.observation = get_observed_cost(ec.l.cb);

  if (c.observation != nullptr)
  {
    c.total++;
    // For each nonzero feature in observed namespaces, check it's value.
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
        GD::foreach_feature<mwt, value_policy>(c.all, ec.feature_space[ns], c);
    for (uint64_t policy : c.policies)
    {
      c.evals[policy].cost += get_unbiased_cost(c.observation, c.evals[policy].action);
      c.evals[policy].action = 0;
    }
  }
  if (exclude || learn)
  {
    c.indices.clear();
    uint32_t stride_shift = c.all->weights.stride_shift();
    uint64_t weight_mask = c.all->weights.mask();
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
      {
        c.indices.push_back(ns);
        if (learn)
        {
          c.feature_space[ns].clear();
          for (features::iterator& f : ec.feature_space[ns])
          {
            uint64_t new_index = ((f.index() & weight_mask) >> stride_shift) * c.num_classes + (uint64_t)f.value();
            c.feature_space[ns].push_back(1, new_index << stride_shift);
          }
        }
        std::swap(c.feature_space[ns], ec.feature_space[ns]);
      }
  }

  // modify the predictions to use a vector with a score for each evaluated feature.
  v_array<float> preds = ec.pred.scalars;

  if (learn)
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
  }

  if (exclude || learn)
    while (c.indices.size() > 0)
    {
      unsigned char ns = c.indices.pop();
      swap(c.feature_space[ns], ec.feature_space[ns]);
    }

  // modify the predictions to use a vector with a score for each evaluated feature.
  preds.clear();
  if (learn)
    preds.push_back((float)ec.pred.multiclass);
  for (uint64_t index : c.policies) preds.push_back((float)c.evals[index].cost / (float)c.total);

  ec.pred.scalars = preds;
}